

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O1

void onlyRightProcessMemoryTemps
               (AssemblyCommands *newAssemblyCommands,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *spilledToOffset,CTemp *beginSP,shared_ptr<AssemblyCode::AssemblyCommand> *thisShared
               ,CTemp *rightOperand)

{
  iterator iVar1;
  CTemp rightTemp;
  string rightName;
  undefined1 local_a9;
  string local_a8;
  int local_84;
  string local_80;
  shared_ptr<AssemblyCode::AssemblyCommand> local_60;
  string local_50;
  
  IRT::CTemp::ToString_abi_cxx11_(&local_50,rightOperand);
  IRT::CTemp::ToString_abi_cxx11_(&local_a8,rightOperand);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&spilledToOffset->_M_t,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)iVar1._M_node != &(spilledToOffset->_M_t)._M_impl.super__Rb_tree_header) {
    IRT::CTemp::CTemp((CTemp *)&local_a8);
    local_84 = -iVar1._M_node[2]._M_color;
    local_80._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<AssemblyCode::MoveMemFromRegPlusConstToReg,std::allocator<AssemblyCode::MoveMemFromRegPlusConstToReg>,IRT::CTemp&,IRT::CTemp&,int>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length,
               (MoveMemFromRegPlusConstToReg **)&local_80,
               (allocator<AssemblyCode::MoveMemFromRegPlusConstToReg> *)&local_a9,(CTemp *)&local_a8
               ,beginSP,&local_84);
    local_60.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_80._M_dataplus._M_p;
    local_60.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length;
    std::
    vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
    ::emplace_back<std::shared_ptr<AssemblyCode::AssemblyCommand>>
              ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                *)newAssemblyCommands,&local_60);
    if (local_60.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.
                 super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    IRT::CTemp::ToString_abi_cxx11_(&local_80,(CTemp *)&local_a8);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  std::
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ::push_back(newAssemblyCommands,thisShared);
  IRT::CTemp::setName(rightOperand,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void onlyRightProcessMemoryTemps(AssemblyCommands &newAssemblyCommands,
                                 std::map<std::string, int> &spilledToOffset,
                                 IRT::CTemp& beginSP,
                                 std::shared_ptr<AssemblyCode::AssemblyCommand> thisShared,
                                 IRT::CTemp& rightOperand) {

    std::string rightName = rightOperand.ToString();

    auto rightFind = spilledToOffset.find(rightOperand.ToString());

    if (rightFind != spilledToOffset.end()) {
        IRT::CTemp rightTemp;
        newAssemblyCommands.push_back(createLoad(rightTemp, rightFind->second, beginSP));

        rightName = rightTemp.ToString();
    }

    newAssemblyCommands.push_back(thisShared);

    rightOperand.setName(rightName);
}